

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O0

void __thiscall dtc::fdt::device_tree::write<dtc::dtb::asm_writer>(device_tree *this,int fd)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  element_type *this_00;
  device_tree *__n;
  size_t __n_00;
  void *__buf;
  void *__buf_00;
  allocator<char> local_299;
  string local_298;
  uint local_278;
  allocator<char> local_271;
  uint32_t i_2;
  allocator<char> local_249;
  string local_248;
  allocator<char> local_221;
  string local_220;
  uint local_200;
  allocator<char> local_1f9;
  uint32_t i_1;
  allocator<char> local_1d1;
  string local_1d0;
  reference local_1b0;
  pair<unsigned_long,_unsigned_long> *i;
  iterator __end2;
  iterator __begin2;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  *__range2;
  string local_188;
  allocator<char> local_161;
  string local_160;
  undefined1 local_140 [8];
  asm_writer strings_writer;
  asm_writer struct_writer;
  asm_writer reservation_writer;
  asm_writer head_writer;
  undefined1 local_90 [8];
  header head;
  string_table st;
  int fd_local;
  device_tree *this_local;
  
  dtb::string_table::string_table((string_table *)&head.size_dt_strings);
  dtb::header::header((header *)local_90);
  dtb::asm_writer::asm_writer((asm_writer *)&reservation_writer.byte_count);
  dtb::asm_writer::asm_writer((asm_writer *)&struct_writer.byte_count);
  dtb::asm_writer::asm_writer((asm_writer *)&strings_writer.byte_count);
  dtb::asm_writer::asm_writer((asm_writer *)local_140);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,"Memory reservations",&local_161);
  dtb::asm_writer::write_comment((asm_writer *)&struct_writer.byte_count,&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator(&local_161);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_188,"dt_reserve_map",(allocator<char> *)((long)&__range2 + 7));
  dtb::asm_writer::write_label((asm_writer *)&struct_writer.byte_count,&local_188);
  std::__cxx11::string::~string((string *)&local_188);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
  __end2 = std::
           vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ::begin(&this->reservations);
  i = (pair<unsigned_long,_unsigned_long> *)
      std::
      vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ::end(&this->reservations);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                                *)&i);
    if (!bVar1) break;
    local_1b0 = __gnu_cxx::
                __normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                ::operator*(&__end2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d0,"Reservation start",&local_1d1);
    dtb::asm_writer::write_comment((asm_writer *)&struct_writer.byte_count,&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::allocator<char>::~allocator(&local_1d1);
    dtb::asm_writer::write_data((asm_writer *)&struct_writer.byte_count,local_1b0->first);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&i_1,"Reservation length",&local_1f9);
    dtb::asm_writer::write_comment((asm_writer *)&struct_writer.byte_count,(string *)&i_1);
    std::__cxx11::string::~string((string *)&i_1);
    std::allocator<char>::~allocator(&local_1f9);
    dtb::asm_writer::write_data((asm_writer *)&struct_writer.byte_count,local_1b0->second);
    __gnu_cxx::
    __normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
    ::operator++(&__end2);
  }
  for (local_200 = 0; local_200 <= this->spare_reserve_map_entries; local_200 = local_200 + 1) {
    dtb::asm_writer::write_data((asm_writer *)&struct_writer.byte_count,0);
    dtb::asm_writer::write_data((asm_writer *)&struct_writer.byte_count,0);
  }
  __n = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,"Device tree",&local_221);
  dtb::asm_writer::write_comment((asm_writer *)&strings_writer.byte_count,&local_220);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator(&local_221);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_248,"dt_struct_start",&local_249);
  dtb::asm_writer::write_label((asm_writer *)&strings_writer.byte_count,&local_248);
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator(&local_249);
  this_00 = std::__shared_ptr_access<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->root);
  node::write(this_00,(int)&strings_writer + 0x20,&head.size_dt_strings,(size_t)__n);
  dtb::output_writer::write_token((output_writer *)&strings_writer.byte_count,FDT_END);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&i_2,"dt_struct_end",&local_271);
  dtb::asm_writer::write_label((asm_writer *)&strings_writer.byte_count,(string *)&i_2);
  std::__cxx11::string::~string((string *)&i_2);
  std::allocator<char>::~allocator(&local_271);
  dtb::string_table::write((string_table *)&head.size_dt_strings,(int)local_140,__buf,(size_t)__n);
  head.last_comp_version = dtb::asm_writer::size((asm_writer *)local_140);
  for (local_278 = 0; local_278 < this->blob_padding; local_278 = local_278 + 1) {
    dtb::asm_writer::write_data((asm_writer *)local_140,'\0');
  }
  uVar2 = dtb::asm_writer::size((asm_writer *)local_140);
  uVar3 = dtb::asm_writer::size((asm_writer *)&strings_writer.byte_count);
  uVar4 = dtb::asm_writer::size((asm_writer *)&struct_writer.byte_count);
  local_90._4_4_ = uVar2 + 0x28 + uVar3 + uVar4;
  while ((uint)local_90._4_4_ < this->minimum_blob_size) {
    local_90._4_4_ = local_90._4_4_ + 1;
    dtb::asm_writer::write_data((asm_writer *)local_140,'\0');
  }
  uVar2 = dtb::asm_writer::size((asm_writer *)&struct_writer.byte_count);
  head.magic = uVar2 + 0x28;
  uVar3 = dtb::asm_writer::size((asm_writer *)&strings_writer.byte_count);
  head.totalsize = uVar2 + 0x28 + uVar3;
  __n_00 = (size_t)head.totalsize;
  head.off_dt_struct = 0x28;
  head.version = this->boot_cpu;
  head.boot_cpuid_phys = dtb::asm_writer::size((asm_writer *)&strings_writer.byte_count);
  dtb::header::write((header *)local_90,(int)&reservation_writer + 0x20,__buf_00,__n_00);
  dtb::asm_writer::write_to_file((asm_writer *)&reservation_writer.byte_count,fd);
  dtb::asm_writer::write_to_file((asm_writer *)&struct_writer.byte_count,fd);
  dtb::asm_writer::write_to_file((asm_writer *)&strings_writer.byte_count,fd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,"dt_blob_end",&local_299);
  dtb::asm_writer::write_label((asm_writer *)local_140,&local_298);
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::~allocator(&local_299);
  dtb::asm_writer::write_to_file((asm_writer *)local_140,fd);
  dtb::asm_writer::~asm_writer((asm_writer *)local_140);
  dtb::asm_writer::~asm_writer((asm_writer *)&strings_writer.byte_count);
  dtb::asm_writer::~asm_writer((asm_writer *)&struct_writer.byte_count);
  dtb::asm_writer::~asm_writer((asm_writer *)&reservation_writer.byte_count);
  dtb::string_table::~string_table((string_table *)&head.size_dt_strings);
  return;
}

Assistant:

void
device_tree::write(int fd)
{
	dtb::string_table st;
	dtb::header head;
	writer head_writer;
	writer reservation_writer;
	writer struct_writer;
	writer strings_writer;

	// Build the reservation table
	reservation_writer.write_comment(string("Memory reservations"));
	reservation_writer.write_label(string("dt_reserve_map"));
	for (auto &i : reservations)
	{
		reservation_writer.write_comment(string("Reservation start"));
		reservation_writer.write_data(i.first);
		reservation_writer.write_comment(string("Reservation length"));
		reservation_writer.write_data(i.second);
	}
	// Write n spare reserve map entries, plus the trailing 0.
	for (uint32_t i=0 ; i<=spare_reserve_map_entries ; i++)
	{
		reservation_writer.write_data((uint64_t)0);
		reservation_writer.write_data((uint64_t)0);
	}


	struct_writer.write_comment(string("Device tree"));
	struct_writer.write_label(string("dt_struct_start"));
	root->write(struct_writer, st);
	struct_writer.write_token(dtb::FDT_END);
	struct_writer.write_label(string("dt_struct_end"));

	st.write(strings_writer);
	// Find the strings size before we stick padding on the end.
	// Note: We should possibly use a new writer for the padding.
	head.size_dt_strings = strings_writer.size();

	// Stick the padding in the strings writer, but after the
	// marker indicating that it's the end.
	// Note: We probably should add a padding call to the writer so
	// that the asm back end can write padding directives instead
	// of a load of 0 bytes.
	for (uint32_t i=0 ; i<blob_padding ; i++)
	{
		strings_writer.write_data((uint8_t)0);
	}
	head.totalsize = sizeof(head) + strings_writer.size() +
		struct_writer.size() + reservation_writer.size();
	while (head.totalsize < minimum_blob_size)
	{
		head.totalsize++;
		strings_writer.write_data((uint8_t)0);
	}
	head.off_dt_struct = sizeof(head) + reservation_writer.size();;
	head.off_dt_strings = head.off_dt_struct + struct_writer.size();
	head.off_mem_rsvmap = sizeof(head);
	head.boot_cpuid_phys = boot_cpu;
	head.size_dt_struct = struct_writer.size();
	head.write(head_writer);

	head_writer.write_to_file(fd);
	reservation_writer.write_to_file(fd);
	struct_writer.write_to_file(fd);
	strings_writer.write_label(string("dt_blob_end"));
	strings_writer.write_to_file(fd);
}